

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

size_t __thiscall edition_unittest::TestAllTypes::ByteSizeLong(TestAllTypes *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  type_conflict tVar4;
  type_conflict tVar5;
  int32_t iVar6;
  uint32_t uVar7;
  ImportEnum IVar8;
  TestAllTypes_NestedEnum TVar9;
  ForeignEnum FVar10;
  OneofFieldCase OVar11;
  RepeatedField<int> *pRVar12;
  size_t sVar13;
  RepeatedField<long> *pRVar14;
  size_t sVar15;
  RepeatedField<unsigned_int> *value;
  size_t sVar16;
  RepeatedField<unsigned_long> *value_00;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar27;
  size_t sVar28;
  const_reference pbVar29;
  RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup> *this_00;
  reference value_01;
  RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *pRVar30;
  RepeatedPtrField<edition_unittest::ForeignMessage> *this_01;
  reference value_02;
  RepeatedPtrField<proto2_unittest_import::ImportMessage> *this_02;
  reference value_03;
  reference pTVar31;
  uint32_t *puVar32;
  string *psVar33;
  int64_t iVar34;
  uint64_t uVar35;
  Cord *value_04;
  string_view sVar36;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string_view value_09;
  string_view value_10;
  string_view value_11;
  string_view value_12;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  WireFormatLite *local_220;
  WireFormatLite *local_210;
  WireFormatLite *local_200;
  WireFormatLite *local_1f0;
  WireFormatLite *local_1e0;
  WireFormatLite *local_1d0;
  WireFormatLite *local_1c0;
  WireFormatLite *local_1b0;
  WireFormatLite *local_1a0;
  TestAllTypes_NestedMessage *msg_4;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *__range2_4;
  int n_3;
  int i_3;
  int n_2;
  int i_2;
  ImportMessage *msg_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  RepeatedPtrField<proto2_unittest_import::ImportMessage> *__range2_3;
  ForeignMessage *msg_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<edition_unittest::ForeignMessage> *__range2_2;
  TestAllTypes_NestedMessage *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *__range2_1;
  TestAllTypes_RepeatedGroup *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup> *__range2;
  int n_1;
  int i_1;
  int n;
  int i;
  size_t tag_size_6;
  size_t data_size_6;
  size_t tag_size_5;
  size_t data_size_5;
  size_t tag_size_4;
  size_t data_size_4;
  size_t tag_size_3;
  size_t data_size_3;
  size_t tag_size_2;
  size_t data_size_2;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestAllTypes *this_;
  TestAllTypes *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar12 = _internal_repeated_int32(this);
  sVar13 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                     (pRVar12,2,&(this->field_0)._impl_._repeated_int32_cached_byte_size_);
  pRVar14 = _internal_repeated_int64(this);
  sVar15 = google::protobuf::internal::WireFormatLite::Int64SizeWithPackedTagSize
                     (pRVar14,2,&(this->field_0)._impl_._repeated_int64_cached_byte_size_);
  value = _internal_repeated_uint32(this);
  sVar16 = google::protobuf::internal::WireFormatLite::UInt32SizeWithPackedTagSize
                     (value,2,&(this->field_0)._impl_._repeated_uint32_cached_byte_size_);
  value_00 = _internal_repeated_uint64(this);
  sVar17 = google::protobuf::internal::WireFormatLite::UInt64SizeWithPackedTagSize
                     (value_00,2,&(this->field_0)._impl_._repeated_uint64_cached_byte_size_);
  pRVar12 = _internal_repeated_sint32(this);
  sVar18 = google::protobuf::internal::WireFormatLite::SInt32SizeWithPackedTagSize
                     (pRVar12,2,&(this->field_0)._impl_._repeated_sint32_cached_byte_size_);
  pRVar14 = _internal_repeated_sint64(this);
  sVar19 = google::protobuf::internal::WireFormatLite::SInt64SizeWithPackedTagSize
                     (pRVar14,2,&(this->field_0)._impl_._repeated_sint64_cached_byte_size_);
  iVar3 = _internal_repeated_fixed32_size(this);
  sVar20 = google::protobuf::internal::FromIntSize(iVar3);
  lVar21 = sVar20 * 4;
  if (lVar21 == 0) {
    local_228 = 0;
  }
  else {
    sVar20 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar21);
    local_228 = sVar20 + 2;
  }
  iVar3 = _internal_repeated_fixed64_size(this);
  sVar20 = google::protobuf::internal::FromIntSize(iVar3);
  lVar22 = sVar20 * 8;
  if (lVar22 == 0) {
    local_230 = 0;
  }
  else {
    sVar20 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar22);
    local_230 = sVar20 + 2;
  }
  iVar3 = _internal_repeated_sfixed32_size(this);
  sVar20 = google::protobuf::internal::FromIntSize(iVar3);
  lVar23 = sVar20 * 4;
  if (lVar23 == 0) {
    local_238 = 0;
  }
  else {
    sVar20 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar23);
    local_238 = sVar20 + 2;
  }
  iVar3 = _internal_repeated_sfixed64_size(this);
  sVar20 = google::protobuf::internal::FromIntSize(iVar3);
  lVar24 = sVar20 * 8;
  if (lVar24 == 0) {
    local_240 = 0;
  }
  else {
    sVar20 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar24);
    local_240 = sVar20 + 2;
  }
  iVar3 = _internal_repeated_float_size(this);
  sVar20 = google::protobuf::internal::FromIntSize(iVar3);
  lVar25 = sVar20 * 4;
  if (lVar25 == 0) {
    local_248 = 0;
  }
  else {
    sVar20 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar25);
    local_248 = sVar20 + 2;
  }
  iVar3 = _internal_repeated_double_size(this);
  sVar20 = google::protobuf::internal::FromIntSize(iVar3);
  lVar26 = sVar20 * 8;
  if (lVar26 == 0) {
    local_250 = 0;
  }
  else {
    sVar20 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar26);
    local_250 = sVar20 + 2;
  }
  iVar3 = _internal_repeated_bool_size(this);
  sVar20 = google::protobuf::internal::FromIntSize(iVar3);
  if (sVar20 == 0) {
    local_258 = 0;
  }
  else {
    sVar28 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar20);
    local_258 = sVar28 + 2;
  }
  pRVar27 = _internal_repeated_string_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar27);
  sVar28 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar28 * 2 +
              local_258 + sVar20 +
              local_250 + lVar26 +
              local_248 + lVar25 +
              local_240 + lVar24 +
              local_238 + lVar23 +
              local_230 + lVar22 +
              local_228 + lVar21 + sVar19 + sVar18 + sVar17 + sVar16 + sVar15 + sVar13;
  i_1 = 0;
  pRVar27 = _internal_repeated_string_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar27);
  for (; i_1 < iVar3; i_1 = i_1 + 1) {
    pRVar27 = _internal_repeated_string_abi_cxx11_(this);
    pbVar29 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar27,i_1);
    sVar13 = google::protobuf::internal::WireFormatLite::StringSize(pbVar29);
    sStack_58 = sVar13 + sStack_58;
  }
  pRVar27 = _internal_repeated_bytes_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar27);
  sVar13 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar13 * 2 + sStack_58;
  __range2._4_4_ = 0;
  pRVar27 = _internal_repeated_bytes_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar27);
  for (; __range2._4_4_ < iVar3; __range2._4_4_ = __range2._4_4_ + 1) {
    pRVar27 = _internal_repeated_bytes_abi_cxx11_(this);
    pbVar29 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar27,__range2._4_4_);
    sVar13 = google::protobuf::internal::WireFormatLite::BytesSize(pbVar29);
    sStack_58 = sVar13 + sStack_58;
  }
  iVar3 = _internal_repeatedgroup_size(this);
  sStack_58 = (long)iVar3 * 4 + sStack_58;
  this_00 = _internal_repeatedgroup(this);
  __end2 = google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup>::begin
                     (this_00);
  msg = (TestAllTypes_RepeatedGroup *)
        google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup>::end
                  (this_00);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar2) {
    value_01 = google::protobuf::internal::
               RepeatedPtrIterator<const_edition_unittest::TestAllTypes_RepeatedGroup>::operator*
                         (&__end2);
    sVar13 = google::protobuf::internal::WireFormatLite::
             GroupSize<edition_unittest::TestAllTypes_RepeatedGroup>(value_01);
    sStack_58 = sVar13 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_edition_unittest::TestAllTypes_RepeatedGroup>::operator++(&__end2);
  }
  iVar3 = _internal_repeated_nested_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  pRVar30 = _internal_repeated_nested_message(this);
  __end2_1 = google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage>::begin
                       (pRVar30);
  msg_1 = (TestAllTypes_NestedMessage *)
          google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage>::end
                    (pRVar30);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_1,(iterator *)&msg_1), bVar2) {
    pTVar31 = google::protobuf::internal::
              RepeatedPtrIterator<const_edition_unittest::TestAllTypes_NestedMessage>::operator*
                        (&__end2_1);
    sVar13 = google::protobuf::internal::WireFormatLite::
             MessageSize<edition_unittest::TestAllTypes_NestedMessage>(pTVar31);
    sStack_58 = sVar13 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_edition_unittest::TestAllTypes_NestedMessage>::operator++(&__end2_1);
  }
  iVar3 = _internal_repeated_foreign_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  this_01 = _internal_repeated_foreign_message(this);
  __end2_2 = google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::begin(this_01);
  msg_2 = (ForeignMessage *)
          google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::end(this_01);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_2,(iterator *)&msg_2), bVar2) {
    value_02 = google::protobuf::internal::
               RepeatedPtrIterator<const_edition_unittest::ForeignMessage>::operator*(&__end2_2);
    sVar13 = google::protobuf::internal::WireFormatLite::
             MessageSize<edition_unittest::ForeignMessage>(value_02);
    sStack_58 = sVar13 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_edition_unittest::ForeignMessage>::
    operator++(&__end2_2);
  }
  iVar3 = _internal_repeated_import_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  this_02 = _internal_repeated_import_message(this);
  __end2_3 = google::protobuf::RepeatedPtrField<proto2_unittest_import::ImportMessage>::begin
                       (this_02);
  msg_3 = (ImportMessage *)
          google::protobuf::RepeatedPtrField<proto2_unittest_import::ImportMessage>::end(this_02);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_3,(iterator *)&msg_3), bVar2) {
    value_03 = google::protobuf::internal::
               RepeatedPtrIterator<const_proto2_unittest_import::ImportMessage>::operator*
                         (&__end2_3);
    sVar13 = google::protobuf::internal::WireFormatLite::
             MessageSize<proto2_unittest_import::ImportMessage>(value_03);
    sStack_58 = sVar13 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest_import::ImportMessage>::
    operator++(&__end2_3);
  }
  pRVar12 = _internal_repeated_nested_enum(this);
  sVar13 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (pRVar12,2,&(this->field_0)._impl_._repeated_nested_enum_cached_byte_size_);
  pRVar12 = _internal_repeated_foreign_enum(this);
  sVar15 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (pRVar12,2,&(this->field_0)._impl_._repeated_foreign_enum_cached_byte_size_);
  pRVar12 = _internal_repeated_import_enum(this);
  sVar16 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (pRVar12,2,&(this->field_0)._impl_._repeated_import_enum_cached_byte_size_);
  pRVar27 = _internal_repeated_string_piece_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar27);
  sVar17 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar17 * 2 + sVar16 + sVar15 + sVar13 + sStack_58;
  i_3 = 0;
  pRVar27 = _internal_repeated_string_piece_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar27);
  for (; i_3 < iVar3; i_3 = i_3 + 1) {
    pRVar27 = _internal_repeated_string_piece_abi_cxx11_(this);
    pbVar29 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar27,i_3);
    sVar13 = google::protobuf::internal::WireFormatLite::StringSize(pbVar29);
    sStack_58 = sVar13 + sStack_58;
  }
  pRVar27 = _internal_repeated_cord_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar27);
  sVar13 = google::protobuf::internal::FromIntSize(iVar3);
  sStack_58 = sVar13 * 2 + sStack_58;
  __range2_4._4_4_ = 0;
  pRVar27 = _internal_repeated_cord_abi_cxx11_(this);
  iVar3 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar27);
  for (; __range2_4._4_4_ < iVar3; __range2_4._4_4_ = __range2_4._4_4_ + 1) {
    pRVar27 = _internal_repeated_cord_abi_cxx11_(this);
    pbVar29 = google::protobuf::
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Get(pRVar27,__range2_4._4_4_);
    sVar13 = google::protobuf::internal::WireFormatLite::StringSize(pbVar29);
    sStack_58 = sVar13 + sStack_58;
  }
  iVar3 = _internal_repeated_lazy_message_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  pRVar30 = _internal_repeated_lazy_message(this);
  __end2_4 = google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage>::begin
                       (pRVar30);
  msg_4 = (TestAllTypes_NestedMessage *)
          google::protobuf::RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage>::end
                    (pRVar30);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2_4,(iterator *)&msg_4), bVar2) {
    pTVar31 = google::protobuf::internal::
              RepeatedPtrIterator<const_edition_unittest::TestAllTypes_NestedMessage>::operator*
                        (&__end2_4);
    sVar13 = google::protobuf::internal::WireFormatLite::
             MessageSize<edition_unittest::TestAllTypes_NestedMessage>(pTVar31);
    sStack_58 = sVar13 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_edition_unittest::TestAllTypes_NestedMessage>::operator++(&__end2_4);
  }
  puVar32 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,0)
  ;
  uVar1 = *puVar32;
  tVar4 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0x4c0000);
  tVar5 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0x320000);
  sStack_58 = (long)(int)((uint)((uVar1 & 0x800000) != 0) << 1) +
              (long)(tVar5 * 5) + (long)(tVar4 * 9) + sStack_58;
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar36 = _internal_optional_string(this);
      local_1a0 = (WireFormatLite *)sVar36._M_len;
      sVar36._M_len = (size_t)sVar36._M_str;
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(local_1a0,sVar36);
      sStack_58 = sVar13 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      sVar36 = _internal_optional_bytes(this);
      value_05._M_str = sVar36._M_str;
      local_1b0 = (WireFormatLite *)sVar36._M_len;
      value_05._M_len = (size_t)value_05._M_str;
      sVar13 = google::protobuf::internal::WireFormatLite::BytesSize(local_1b0,value_05);
      sStack_58 = sVar13 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      sVar36 = _internal_optional_string_piece(this);
      value_06._M_str = sVar36._M_str;
      local_1c0 = (WireFormatLite *)sVar36._M_len;
      value_06._M_len = (size_t)value_06._M_str;
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(local_1c0,value_06);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      psVar33 = _internal_optional_cord_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(psVar33);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               GroupSize<edition_unittest::TestAllTypes_OptionalGroup>
                         ((this->field_0)._impl_.optionalgroup_);
      sStack_58 = sVar13 + 4 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<edition_unittest::TestAllTypes_NestedMessage>
                         ((this->field_0)._impl_.optional_nested_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<edition_unittest::ForeignMessage>
                         ((this->field_0)._impl_.optional_foreign_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x80) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_unittest_import::ImportMessage>
                         ((this->field_0)._impl_.optional_import_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<proto2_unittest_import::PublicImportMessage>
                         ((this->field_0)._impl_.optional_public_import_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x200) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<edition_unittest::TestAllTypes_NestedMessage>
                         ((this->field_0)._impl_.optional_lazy_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x400) != 0) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<edition_unittest::TestAllTypes_NestedMessage>
                         ((this->field_0)._impl_.optional_unverified_lazy_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x800) != 0) {
      iVar34 = _internal_optional_int64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::Int64SizePlusOne(iVar34);
      sStack_58 = sVar13 + sStack_58;
    }
    if ((uVar1 & 0x1000) != 0) {
      iVar6 = _internal_optional_int32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::Int32SizePlusOne(iVar6);
      sStack_58 = sVar13 + sStack_58;
    }
    if ((uVar1 & 0x2000) != 0) {
      uVar7 = _internal_optional_uint32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::UInt32SizePlusOne(uVar7);
      sStack_58 = sVar13 + sStack_58;
    }
    if ((uVar1 & 0x4000) != 0) {
      uVar35 = _internal_optional_uint64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar35);
      sStack_58 = sVar13 + sStack_58;
    }
    if ((uVar1 & 0x8000) != 0) {
      iVar34 = _internal_optional_sint64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::SInt64SizePlusOne(iVar34);
      sStack_58 = sVar13 + sStack_58;
    }
  }
  if ((uVar1 & 0x10000) != 0) {
    iVar6 = _internal_optional_sint32(this);
    sVar13 = google::protobuf::internal::WireFormatLite::SInt32SizePlusOne(iVar6);
    sStack_58 = sVar13 + sStack_58;
  }
  if ((uVar1 & 0xff000000) != 0) {
    if ((uVar1 & 0x1000000) != 0) {
      IVar8 = _internal_optional_import_enum(this);
      sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(IVar8);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x2000000) != 0) {
      TVar9 = _internal_optional_nested_enum(this);
      sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(TVar9);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x4000000) != 0) {
      FVar10 = _internal_optional_foreign_enum(this);
      sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(FVar10);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x8000000) != 0) {
      sVar36 = _internal_default_string(this);
      value_07._M_str = sVar36._M_str;
      local_1d0 = (WireFormatLite *)sVar36._M_len;
      value_07._M_len = (size_t)value_07._M_str;
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(local_1d0,value_07);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x10000000) != 0) {
      sVar36 = _internal_default_bytes(this);
      value_08._M_str = sVar36._M_str;
      local_1e0 = (WireFormatLite *)sVar36._M_len;
      value_08._M_len = (size_t)value_08._M_str;
      sVar13 = google::protobuf::internal::WireFormatLite::BytesSize(local_1e0,value_08);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x20000000) != 0) {
      sVar36 = _internal_default_string_piece(this);
      value_09._M_str = sVar36._M_str;
      local_1f0 = (WireFormatLite *)sVar36._M_len;
      value_09._M_len = (size_t)value_09._M_str;
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(local_1f0,value_09);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x40000000) != 0) {
      psVar33 = _internal_default_cord_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(psVar33);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x80000000) != 0) {
      value_04 = _internal_optional_bytes_cord(this);
      sVar13 = google::protobuf::internal::WireFormatLite::BytesSize(value_04);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
  }
  puVar32 = google::protobuf::internal::HasBits<2>::operator[](&(this->field_0)._impl_._has_bits_,1)
  ;
  uVar1 = *puVar32;
  tVar4 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0x980);
  tVar5 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0x640);
  sStack_58 = (long)(int)((uint)((uVar1 & 0x1000) != 0) * 3) +
              (long)(tVar5 * 6) + (long)(tVar4 * 10) + sStack_58;
  if ((uVar1 & 0x3f) != 0) {
    if ((uVar1 & 1) != 0) {
      iVar34 = _internal_default_int64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::Int64Size(iVar34);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      iVar6 = _internal_default_int32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::Int32Size(iVar6);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      uVar7 = _internal_default_uint32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar7);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      uVar35 = _internal_default_uint64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar35);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      iVar34 = _internal_default_sint64(this);
      sVar13 = google::protobuf::internal::WireFormatLite::SInt64Size(iVar34);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      iVar6 = _internal_default_sint32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::SInt32Size(iVar6);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
  }
  if ((uVar1 & 0xe000) != 0) {
    if ((uVar1 & 0x2000) != 0) {
      TVar9 = _internal_default_nested_enum(this);
      sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(TVar9);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x4000) != 0) {
      FVar10 = _internal_default_foreign_enum(this);
      sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(FVar10);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    if ((uVar1 & 0x8000) != 0) {
      IVar8 = _internal_default_import_enum(this);
      sVar13 = google::protobuf::internal::WireFormatLite::EnumSize(IVar8);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
  }
  OVar11 = oneof_field_case(this);
  if (OVar11 != ONEOF_FIELD_NOT_SET) {
    if (OVar11 == kOneofUint32) {
      uVar7 = _internal_oneof_uint32(this);
      sVar13 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar7);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    else if (OVar11 == kOneofNestedMessage) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<edition_unittest::TestAllTypes_NestedMessage>
                         ((this->field_0)._impl_.oneof_field_.oneof_nested_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    else if (OVar11 == kOneofString) {
      sVar36 = _internal_oneof_string(this);
      value_10._M_str = sVar36._M_str;
      local_200 = (WireFormatLite *)sVar36._M_len;
      value_10._M_len = (size_t)value_10._M_str;
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(local_200,value_10);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    else if (OVar11 == kOneofBytes) {
      sVar36 = _internal_oneof_bytes(this);
      value_11._M_str = sVar36._M_str;
      local_210 = (WireFormatLite *)sVar36._M_len;
      value_11._M_len = (size_t)value_11._M_str;
      sVar13 = google::protobuf::internal::WireFormatLite::BytesSize(local_210,value_11);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    else if (OVar11 == kOneofCord) {
      psVar33 = _internal_oneof_cord_abi_cxx11_(this);
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(psVar33);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    else if (OVar11 == kOneofStringPiece) {
      sVar36 = _internal_oneof_string_piece(this);
      value_12._M_str = sVar36._M_str;
      local_220 = (WireFormatLite *)sVar36._M_len;
      value_12._M_len = (size_t)value_12._M_str;
      sVar13 = google::protobuf::internal::WireFormatLite::StringSize(local_220,value_12);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
    else if (OVar11 == kOneofLazyNestedMessage) {
      sVar13 = google::protobuf::internal::WireFormatLite::
               MessageSize<edition_unittest::TestAllTypes_NestedMessage>
                         ((this->field_0)._impl_.oneof_field_.oneof_nested_message_);
      sStack_58 = sVar13 + 2 + sStack_58;
    }
  }
  sVar13 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                     (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar13;
}

Assistant:

::size_t TestAllTypes::ByteSizeLong() const {
  const TestAllTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestAllTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 31;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32(), 2,
              this_._impl_._repeated_int32_cached_byte_size_);
    }
    // repeated int64 repeated_int64 = 32;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int64SizeWithPackedTagSize(
              this_._internal_repeated_int64(), 2,
              this_._impl_._repeated_int64_cached_byte_size_);
    }
    // repeated uint32 repeated_uint32 = 33;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt32SizeWithPackedTagSize(
              this_._internal_repeated_uint32(), 2,
              this_._impl_._repeated_uint32_cached_byte_size_);
    }
    // repeated uint64 repeated_uint64 = 34;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt64SizeWithPackedTagSize(
              this_._internal_repeated_uint64(), 2,
              this_._impl_._repeated_uint64_cached_byte_size_);
    }
    // repeated sint32 repeated_sint32 = 35;
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt32SizeWithPackedTagSize(
              this_._internal_repeated_sint32(), 2,
              this_._impl_._repeated_sint32_cached_byte_size_);
    }
    // repeated sint64 repeated_sint64 = 36;
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt64SizeWithPackedTagSize(
              this_._internal_repeated_sint64(), 2,
              this_._impl_._repeated_sint64_cached_byte_size_);
    }
    // repeated fixed32 repeated_fixed32 = 37;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated fixed64 repeated_fixed64 = 38;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 repeated_sfixed32 = 39;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 repeated_sfixed64 = 40;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated float repeated_float = 41;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated double repeated_double = 42;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool repeated_bool = 43;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated string repeated_string = 44;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string().size());
      for (int i = 0, n = this_._internal_repeated_string().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string().Get(i));
      }
    }
    // repeated bytes repeated_bytes = 45;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_bytes().size());
      for (int i = 0, n = this_._internal_repeated_bytes().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::BytesSize(
            this_._internal_repeated_bytes().Get(i));
      }
    }
    // repeated .edition_unittest.TestAllTypes.RepeatedGroup repeatedgroup = 46 [features = {
    {
      total_size += 4UL * this_._internal_repeatedgroup_size();
      for (const auto& msg : this_._internal_repeatedgroup()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
    // repeated .edition_unittest.TestAllTypes.NestedMessage repeated_nested_message = 48;
    {
      total_size += 2UL * this_._internal_repeated_nested_message_size();
      for (const auto& msg : this_._internal_repeated_nested_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .edition_unittest.ForeignMessage repeated_foreign_message = 49;
    {
      total_size += 2UL * this_._internal_repeated_foreign_message_size();
      for (const auto& msg : this_._internal_repeated_foreign_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest_import.ImportMessage repeated_import_message = 50;
    {
      total_size += 2UL * this_._internal_repeated_import_message_size();
      for (const auto& msg : this_._internal_repeated_import_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .edition_unittest.TestAllTypes.NestedEnum repeated_nested_enum = 51;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_nested_enum(), 2, this_._impl_._repeated_nested_enum_cached_byte_size_);
    }
    // repeated .edition_unittest.ForeignEnum repeated_foreign_enum = 52;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_foreign_enum(), 2, this_._impl_._repeated_foreign_enum_cached_byte_size_);
    }
    // repeated .proto2_unittest_import.ImportEnum repeated_import_enum = 53;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_import_enum(), 2, this_._impl_._repeated_import_enum_cached_byte_size_);
    }
    // repeated string repeated_string_piece = 54 [ctype = STRING_PIECE];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_piece().size());
      for (int i = 0, n = this_._internal_repeated_string_piece().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_piece().Get(i));
      }
    }
    // repeated string repeated_cord = 55 [ctype = CORD];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_cord().size());
      for (int i = 0, n = this_._internal_repeated_cord().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_cord().Get(i));
      }
    }
    // repeated .edition_unittest.TestAllTypes.NestedMessage repeated_lazy_message = 57;
    {
      total_size += 2UL * this_._internal_repeated_lazy_message_size();
      for (const auto& msg : this_._internal_repeated_lazy_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x004c0000u & cached_has_bits) * 9;
  total_size += ::absl::popcount(0x00320000u & cached_has_bits) * 5;
  total_size += static_cast<bool>(0x00800000u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // string optional_string = 14;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string());
    }
    // bytes optional_bytes = 15;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_optional_bytes());
    }
    // string optional_string_piece = 24 [ctype = STRING_PIECE];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_piece());
    }
    // string optional_cord = 25 [ctype = CORD];
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_cord());
    }
    // .edition_unittest.TestAllTypes.OptionalGroup optionalgroup = 16 [features = {
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 4 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.optionalgroup_);
    }
    // .edition_unittest.TestAllTypes.NestedMessage optional_nested_message = 18;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_message_);
    }
    // .edition_unittest.ForeignMessage optional_foreign_message = 19;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_foreign_message_);
    }
    // .proto2_unittest_import.ImportMessage optional_import_message = 20;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_import_message_);
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // .proto2_unittest_import.PublicImportMessage optional_public_import_message = 26;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_public_import_message_);
    }
    // .edition_unittest.TestAllTypes.NestedMessage optional_lazy_message = 27 [lazy = true];
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_lazy_message_);
    }
    // .edition_unittest.TestAllTypes.NestedMessage optional_unverified_lazy_message = 28 [unverified_lazy = true];
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_unverified_lazy_message_);
    }
    // int64 optional_int64 = 2;
    if ((cached_has_bits & 0x00000800u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_optional_int64());
    }
    // int32 optional_int32 = 1;
    if ((cached_has_bits & 0x00001000u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_optional_int32());
    }
    // uint32 optional_uint32 = 3;
    if ((cached_has_bits & 0x00002000u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
          this_._internal_optional_uint32());
    }
    // uint64 optional_uint64 = 4;
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
          this_._internal_optional_uint64());
    }
    // sint64 optional_sint64 = 6;
    if ((cached_has_bits & 0x00008000u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt64SizePlusOne(
          this_._internal_optional_sint64());
    }
  }
   {
    // sint32 optional_sint32 = 5;
    if ((cached_has_bits & 0x00010000u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt32SizePlusOne(
          this_._internal_optional_sint32());
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    // .proto2_unittest_import.ImportEnum optional_import_enum = 23;
    if ((cached_has_bits & 0x01000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_import_enum());
    }
    // .edition_unittest.TestAllTypes.NestedEnum optional_nested_enum = 21;
    if ((cached_has_bits & 0x02000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_nested_enum());
    }
    // .edition_unittest.ForeignEnum optional_foreign_enum = 22;
    if ((cached_has_bits & 0x04000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_foreign_enum());
    }
    // string default_string = 74 [default = "hello"];
    if ((cached_has_bits & 0x08000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_string());
    }
    // bytes default_bytes = 75 [default = "world"];
    if ((cached_has_bits & 0x10000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_default_bytes());
    }
    // string default_string_piece = 84 [default = "abc", ctype = STRING_PIECE];
    if ((cached_has_bits & 0x20000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_string_piece());
    }
    // string default_cord = 85 [default = "123", ctype = CORD];
    if ((cached_has_bits & 0x40000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_cord());
    }
    // bytes optional_bytes_cord = 86 [ctype = CORD];
    if ((cached_has_bits & 0x80000000u) != 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this_._internal_optional_bytes_cord());
    }
  }
  cached_has_bits = this_._impl_._has_bits_[1];
  total_size += ::absl::popcount(0x00000980u & cached_has_bits) * 10;
  total_size += ::absl::popcount(0x00000640u & cached_has_bits) * 6;
  total_size += static_cast<bool>(0x00001000u & cached_has_bits) * 3;
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // int64 default_int64 = 62 [default = 42];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int64Size(
                                      this_._internal_default_int64());
    }
    // int32 default_int32 = 61 [default = 41];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_default_int32());
    }
    // uint32 default_uint32 = 63 [default = 43];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_default_uint32());
    }
    // uint64 default_uint64 = 64 [default = 44];
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt64Size(
                                      this_._internal_default_uint64());
    }
    // sint64 default_sint64 = 66 [default = 46];
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::SInt64Size(
                                      this_._internal_default_sint64());
    }
    // sint32 default_sint32 = 65 [default = -45];
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::SInt32Size(
                                      this_._internal_default_sint32());
    }
  }
  if ((cached_has_bits & 0x0000e000u) != 0) {
    // .edition_unittest.TestAllTypes.NestedEnum default_nested_enum = 81 [default = BAR];
    if ((cached_has_bits & 0x00002000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_nested_enum());
    }
    // .edition_unittest.ForeignEnum default_foreign_enum = 82 [default = FOREIGN_BAR];
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_foreign_enum());
    }
    // .proto2_unittest_import.ImportEnum default_import_enum = 83 [default = IMPORT_BAR];
    if ((cached_has_bits & 0x00008000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_import_enum());
    }
  }
  switch (this_.oneof_field_case()) {
    // uint32 oneof_uint32 = 111;
    case kOneofUint32: {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_oneof_uint32());
      break;
    }
    // .edition_unittest.TestAllTypes.NestedMessage oneof_nested_message = 112;
    case kOneofNestedMessage: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_nested_message_);
      break;
    }
    // string oneof_string = 113;
    case kOneofString: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_string());
      break;
    }
    // bytes oneof_bytes = 114;
    case kOneofBytes: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_oneof_bytes());
      break;
    }
    // string oneof_cord = 115 [ctype = CORD];
    case kOneofCord: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_cord());
      break;
    }
    // string oneof_string_piece = 116 [ctype = STRING_PIECE];
    case kOneofStringPiece: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_string_piece());
      break;
    }
    // .edition_unittest.TestAllTypes.NestedMessage oneof_lazy_nested_message = 117 [lazy = true];
    case kOneofLazyNestedMessage: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_lazy_nested_message_);
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}